

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathDebugDumpObject(FILE *output,xmlXPathObjectPtr cur,int depth)

{
  double dVar1;
  xmlElementType xVar2;
  xmlNodeSetPtr pxVar3;
  xmlNodePtr node;
  _xmlNode *p_Var4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  _xmlNode *node_00;
  char shift [100];
  char local_178 [112];
  char local_108 [112];
  char local_98 [104];
  
  if (output == (FILE *)0x0) {
    return;
  }
  if (depth < 1) {
    uVar9 = 0;
  }
  else {
    uVar11 = 0x18;
    if (depth - 1U < 0x18) {
      uVar11 = depth - 1U;
    }
    uVar9 = (ulong)(uVar11 * 2 + 2);
    memset(local_98,0x20,uVar9);
  }
  (local_98 + uVar9)[0] = '\0';
  (local_98 + uVar9)[1] = '\0';
  fputs(local_98,(FILE *)output);
  if (cur == (xmlXPathObjectPtr)0x0) {
    pcVar8 = "Object is empty (NULL)\n";
    goto LAB_001b8eeb;
  }
  switch(cur->type) {
  case XPATH_UNDEFINED:
    pcVar8 = "Object is uninitialized\n";
    sVar7 = 0x18;
    goto LAB_001b8ef0;
  case XPATH_NODESET:
    fwrite("Object is a Node Set :\n",0x17,1,(FILE *)output);
    pxVar3 = cur->nodesetval;
    if (depth < 1) {
      uVar9 = 0;
    }
    else {
      uVar11 = 0x18;
      if (depth - 1U < 0x18) {
        uVar11 = depth - 1U;
      }
      uVar9 = (ulong)(uVar11 * 2 + 2);
      memset(local_178,0x20,uVar9);
    }
    (local_178 + uVar9)[0] = '\0';
    (local_178 + uVar9)[1] = '\0';
    if (pxVar3 != (xmlNodeSetPtr)0x0) {
      fprintf((FILE *)output,"Set contains %d nodes:\n",(ulong)(uint)pxVar3->nodeNr);
      if (pxVar3->nodeNr < 1) {
        return;
      }
      iVar5 = 0x18;
      if ((uint)depth < 0x18) {
        iVar5 = depth;
      }
      uVar11 = iVar5 * 2 + 2;
      uVar9 = 0;
      do {
        fputs(local_178,(FILE *)output);
        uVar10 = uVar9 + 1;
        fprintf((FILE *)output,"%d",uVar10 & 0xffffffff);
        node = pxVar3->nodeTab[uVar9];
        uVar6 = 0;
        if (-1 < depth) {
          memset(local_108,0x20,(ulong)uVar11);
          uVar6 = uVar11;
        }
        (local_108 + uVar6)[0] = '\0';
        (local_108 + uVar6)[1] = '\0';
        if (node == (xmlNodePtr)0x0) {
          fputs(local_108,(FILE *)output);
          sVar7 = 0xf;
          pcVar8 = "Node is NULL !\n";
LAB_001b9199:
          fwrite(pcVar8,sVar7,1,(FILE *)output);
        }
        else {
          xVar2 = node->type;
          if (xVar2 == XML_ATTRIBUTE_NODE) {
            xmlDebugDumpAttr(output,(xmlAttrPtr)node,depth + 1);
          }
          else {
            if ((xVar2 == XML_HTML_DOCUMENT_NODE) || (xVar2 == XML_DOCUMENT_NODE)) {
              fputs(local_108,(FILE *)output);
              sVar7 = 3;
              pcVar8 = " /\n";
              goto LAB_001b9199;
            }
            xmlDebugDumpOneNode(output,node,depth + 1);
          }
        }
        uVar9 = uVar10;
        if ((long)pxVar3->nodeNr <= (long)uVar10) {
          return;
        }
      } while( true );
    }
    fputs(local_178,(FILE *)output);
    pcVar8 = "NodeSet is NULL !\n";
    sVar7 = 0x12;
    break;
  case XPATH_BOOLEAN:
    fwrite("Object is a Boolean : ",0x16,1,(FILE *)output);
    if (cur->boolval == 0) {
      pcVar8 = "false\n";
      sVar7 = 6;
    }
    else {
      pcVar8 = "true\n";
      sVar7 = 5;
    }
    goto LAB_001b8ef0;
  case XPATH_NUMBER:
    dVar1 = cur->floatval;
    iVar5 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
    if (ABS(dVar1) != INFINITY) {
      iVar5 = 0;
    }
    if (iVar5 == -1) {
      pcVar8 = "Object is a number : -Infinity\n";
      sVar7 = 0x1f;
      goto LAB_001b8ef0;
    }
    if (iVar5 == 1) {
      pcVar8 = "Object is a number : Infinity\n";
      sVar7 = 0x1e;
      goto LAB_001b8ef0;
    }
    if (NAN(dVar1)) {
      pcVar8 = "Object is a number : NaN\n";
      sVar7 = 0x19;
      goto LAB_001b8ef0;
    }
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      fprintf((FILE *)output,"Object is a number : %0g\n");
      return;
    }
    pcVar8 = "Object is a number : 0\n";
    goto LAB_001b8eeb;
  case XPATH_STRING:
    fwrite("Object is a string : ",0x15,1,(FILE *)output);
    xmlDebugDumpString(output,cur->stringval);
    fputc(10,(FILE *)output);
    return;
  default:
    goto switchD_001b8ed4_caseD_5;
  case XPATH_USERS:
    pcVar8 = "Object is user defined\n";
LAB_001b8eeb:
    sVar7 = 0x17;
LAB_001b8ef0:
    fwrite(pcVar8,sVar7,1,(FILE *)output);
    return;
  case XPATH_XSLT_TREE:
    fwrite("Object is an XSLT value tree :\n",0x1f,1,(FILE *)output);
    pxVar3 = cur->nodesetval;
    if (depth < 1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0x18;
      if (depth - 1U < 0x18) {
        uVar11 = depth - 1U;
      }
      memset(local_178,0x20,(ulong)(uVar11 * 2 + 2));
      uVar11 = uVar11 + 1;
    }
    local_178[(ulong)(uVar11 & 0x7fffffff) * 2 + 1] = '\0';
    local_178[(ulong)uVar11 * 2] = '\0';
    if (((pxVar3 == (xmlNodeSetPtr)0x0) || (pxVar3->nodeNr == 0)) ||
       (*pxVar3->nodeTab == (xmlNodePtr)0x0)) {
      fputs(local_178,(FILE *)output);
      pcVar8 = "Value Tree is NULL !\n";
      sVar7 = 0x15;
    }
    else {
      fputs(local_178,(FILE *)output);
      uVar9 = 0;
      fprintf((FILE *)output,"%d",(ulong)(uVar11 + 1));
      node_00 = (*pxVar3->nodeTab)->children;
      if (-1 < depth) {
        iVar5 = 0x18;
        if ((uint)depth < 0x18) {
          iVar5 = depth;
        }
        uVar9 = (ulong)(iVar5 * 2 + 2);
        memset(local_108,0x20,uVar9);
      }
      (local_108 + uVar9)[0] = '\0';
      (local_108 + uVar9)[1] = '\0';
      if (node_00 != (_xmlNode *)0x0) {
        do {
          p_Var4 = node_00->next;
          xmlDebugDumpOneNode(output,node_00,depth + 1);
          node_00 = p_Var4;
        } while (p_Var4 != (_xmlNode *)0x0);
        return;
      }
      fputs(local_108,(FILE *)output);
      pcVar8 = "Node is NULL !\n";
      sVar7 = 0xf;
    }
  }
  fwrite(pcVar8,sVar7,1,(FILE *)output);
switchD_001b8ed4_caseD_5:
  return;
}

Assistant:

void
xmlXPathDebugDumpObject(FILE *output, xmlXPathObjectPtr cur, int depth) {
    int i;
    char shift[100];

    if (output == NULL) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;


    fprintf(output, "%s", shift);

    if (cur == NULL) {
        fprintf(output, "Object is empty (NULL)\n");
	return;
    }
    switch(cur->type) {
        case XPATH_UNDEFINED:
	    fprintf(output, "Object is uninitialized\n");
	    break;
        case XPATH_NODESET:
	    fprintf(output, "Object is a Node Set :\n");
	    xmlXPathDebugDumpNodeSet(output, cur->nodesetval, depth);
	    break;
	case XPATH_XSLT_TREE:
	    fprintf(output, "Object is an XSLT value tree :\n");
	    xmlXPathDebugDumpValueTree(output, cur->nodesetval, depth);
	    break;
        case XPATH_BOOLEAN:
	    fprintf(output, "Object is a Boolean : ");
	    if (cur->boolval) fprintf(output, "true\n");
	    else fprintf(output, "false\n");
	    break;
        case XPATH_NUMBER:
	    switch (xmlXPathIsInf(cur->floatval)) {
	    case 1:
		fprintf(output, "Object is a number : Infinity\n");
		break;
	    case -1:
		fprintf(output, "Object is a number : -Infinity\n");
		break;
	    default:
		if (xmlXPathIsNaN(cur->floatval)) {
		    fprintf(output, "Object is a number : NaN\n");
		} else if (cur->floatval == 0) {
                    /* Omit sign for negative zero. */
		    fprintf(output, "Object is a number : 0\n");
		} else {
		    fprintf(output, "Object is a number : %0g\n", cur->floatval);
		}
	    }
	    break;
        case XPATH_STRING:
	    fprintf(output, "Object is a string : ");
	    xmlDebugDumpString(output, cur->stringval);
	    fprintf(output, "\n");
	    break;
	case XPATH_USERS:
	    fprintf(output, "Object is user defined\n");
	    break;
    }
}